

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ulong __thiscall nuraft::inmem_log_store::term_at(inmem_log_store *this,ulong index)

{
  bool bVar1;
  element_type *this_00;
  iterator entry;
  lock_guard<std::mutex> l;
  ulong term;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  _Self local_40 [3];
  _Self local_28 [2];
  ulong local_18;
  
  local_18 = 0;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x15b162);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_28,local_40);
  if (bVar1) {
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::find(in_stack_ffffffffffffff88,(key_type *)0x15b1b7);
  }
  std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>::
  operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
              *)0x15b1f8);
  this_00 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x15b204);
  local_18 = log_entry::get_term(this_00);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15b227);
  return local_18;
}

Assistant:

ulong inmem_log_store::term_at(ulong index) {
    ulong term = 0;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        term = entry->second->get_term();
    }
    return term;
}